

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O2

int trico_write_vec3_double(void *a,double *vertices,uint32_t nr_of_vertices,trico_stream_type st)

{
  ssize_t sVar1;
  size_t __size;
  int iVar2;
  uint8_t header;
  uint32_t nr_of_compressed_z_bytes;
  uint32_t nr_of_compressed_y_bytes;
  uint32_t nr_of_compressed_x_bytes;
  uint32_t nr_of_vertices_local;
  uint8_t *compressed_z;
  uint8_t *compressed_y;
  uint8_t *compressed_x;
  double *z;
  double *y;
  double *x;
  
  header = (uint8_t)st;
  nr_of_vertices_local = nr_of_vertices;
  sVar1 = write((int)&header,(void *)0x1,1);
  iVar2 = 0;
  if ((int)sVar1 != 0) {
    sVar1 = write((int)&nr_of_vertices_local,(void *)0x4,1);
    if ((int)sVar1 != 0) {
      __size = (ulong)nr_of_vertices << 3;
      x = (double *)malloc(__size);
      y = (double *)malloc(__size);
      z = (double *)malloc(__size);
      trico_transpose_xyz_aos_to_soa_double_precision(&x,&y,&z,vertices,nr_of_vertices);
      trico_compress_double_precision
                (&nr_of_compressed_x_bytes,&compressed_x,x,nr_of_vertices,0x14,0x14);
      free(x);
      sVar1 = write((int)&nr_of_compressed_x_bytes,(void *)0x4,1);
      iVar2 = 0;
      if ((int)sVar1 != 0) {
        sVar1 = write((int)compressed_x,(void *)0x1,(ulong)nr_of_compressed_x_bytes);
        if ((int)sVar1 != 0) {
          free(compressed_x);
          trico_compress_double_precision
                    (&nr_of_compressed_y_bytes,&compressed_y,y,nr_of_vertices,0x14,0x14);
          free(y);
          sVar1 = write((int)&nr_of_compressed_y_bytes,(void *)0x4,1);
          iVar2 = 0;
          if ((int)sVar1 != 0) {
            sVar1 = write((int)compressed_y,(void *)0x1,(ulong)nr_of_compressed_y_bytes);
            if ((int)sVar1 != 0) {
              free(compressed_y);
              trico_compress_double_precision
                        (&nr_of_compressed_z_bytes,&compressed_z,z,nr_of_vertices,0x14,0x14);
              free(z);
              sVar1 = write((int)&nr_of_compressed_z_bytes,(void *)0x4,1);
              iVar2 = 0;
              if ((int)sVar1 != 0) {
                sVar1 = write((int)compressed_z,(void *)0x1,(ulong)nr_of_compressed_z_bytes);
                if ((int)sVar1 != 0) {
                  free(compressed_z);
                  iVar2 = 1;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar2;
}

Assistant:

static int trico_write_vec3_double(void* a, const double* vertices, uint32_t nr_of_vertices, enum trico_stream_type st)
  {
  struct trico_archive* arch = (struct trico_archive*)a;
  uint8_t header = (uint8_t)st;
  if (!write(&header, 1, 1, arch))
    return 0;
  if (!write(&nr_of_vertices, sizeof(uint32_t), 1, arch))
    return 0;

  double* x = (double*)trico_malloc(sizeof(double)*nr_of_vertices);
  double* y = (double*)trico_malloc(sizeof(double)*nr_of_vertices);
  double* z = (double*)trico_malloc(sizeof(double)*nr_of_vertices);
  trico_transpose_xyz_aos_to_soa_double_precision(&x, &y, &z, vertices, nr_of_vertices);

  uint32_t nr_of_compressed_x_bytes;
  uint8_t* compressed_x;
  trico_compress_double_precision(&nr_of_compressed_x_bytes, &compressed_x, x, nr_of_vertices, 20, 20);

  trico_free(x);
  if (!write(&nr_of_compressed_x_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_x, 1, nr_of_compressed_x_bytes, arch))
    return 0;
  trico_free(compressed_x);

  uint32_t nr_of_compressed_y_bytes;
  uint8_t* compressed_y;
  trico_compress_double_precision(&nr_of_compressed_y_bytes, &compressed_y, y, nr_of_vertices, 20, 20);

  trico_free(y);
  if (!write(&nr_of_compressed_y_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_y, 1, nr_of_compressed_y_bytes, arch))
    return 0;
  trico_free(compressed_y);

  uint32_t nr_of_compressed_z_bytes;
  uint8_t* compressed_z;
  trico_compress_double_precision(&nr_of_compressed_z_bytes, &compressed_z, z, nr_of_vertices, 20, 20);

  trico_free(z);
  if (!write(&nr_of_compressed_z_bytes, sizeof(uint32_t), 1, arch))
    return 0;
  if (!write(compressed_z, 1, nr_of_compressed_z_bytes, arch))
    return 0;
  trico_free(compressed_z);
  return 1;
  }